

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O0

void ngx_rbtree_left_rotate
               (ngx_rbtree_node_t **root,ngx_rbtree_node_t *sentinel,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *pnVar1;
  ngx_rbtree_node_t *temp;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_node_t *sentinel_local;
  ngx_rbtree_node_t **root_local;
  
  pnVar1 = node->right;
  node->right = pnVar1->left;
  if (pnVar1->left != sentinel) {
    pnVar1->left->parent = node;
  }
  pnVar1->parent = node->parent;
  if (node == *root) {
    *root = pnVar1;
  }
  else if (node == node->parent->left) {
    node->parent->left = pnVar1;
  }
  else {
    node->parent->right = pnVar1;
  }
  pnVar1->left = node;
  node->parent = pnVar1;
  return;
}

Assistant:

static ngx_inline void
ngx_rbtree_left_rotate(ngx_rbtree_node_t **root, ngx_rbtree_node_t *sentinel,
    ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  *temp;

    temp = node->right;
    node->right = temp->left;

    if (temp->left != sentinel) {
        temp->left->parent = node;
    }

    temp->parent = node->parent;

    if (node == *root) {
        *root = temp;

    } else if (node == node->parent->left) {
        node->parent->left = temp;

    } else {
        node->parent->right = temp;
    }

    temp->left = node;
    node->parent = temp;
}